

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O3

SQRESULT sq_setroottable(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  SQTable *pSVar5;
  SQObjectPtr *pSVar6;
  SQRESULT SVar7;
  
  pSVar6 = SQVM::GetUp(v,-1);
  SVar2 = (pSVar6->super_SQObject)._type;
  pSVar4 = (pSVar6->super_SQObject)._unVal.pTable;
  if ((SVar2 == OT_TABLE) || (SVar2 == OT_NULL)) {
    SVar3 = (v->_roottable).super_SQObject._type;
    pSVar5 = (v->_roottable).super_SQObject._unVal.pTable;
    (v->_roottable).super_SQObject._unVal.pTable = pSVar4;
    (v->_roottable).super_SQObject._type = SVar2;
    if ((SVar2 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 + 1;
    }
    if ((SVar3 >> 0x1b & 1) != 0) {
      pSVar1 = &(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar5->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])
                  ();
      }
    }
    SQVM::Pop(v);
    SVar7 = 0;
  }
  else {
    sq_throwerror(v,"invalid type");
    SVar7 = -1;
  }
  return SVar7;
}

Assistant:

SQRESULT sq_setroottable(HSQUIRRELVM v)
{
    SQObject o = stack_get(v, -1);
    if(sq_istable(o) || sq_isnull(o)) {
        v->_roottable = o;
        v->Pop();
        return SQ_OK;
    }
    return sq_throwerror(v, _SC("invalid type"));
}